

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu_Impl.cpp
# Opt level: O2

blip_time_t __thiscall Vgm_Emu_Impl::run_commands(Vgm_Emu_Impl *this,vgm_time_t end_time)

{
  Ym_Emu<Ym2612_Emu> *this_00;
  byte bVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar4;
  long lVar5;
  size_t __n;
  uint command;
  vgm_time_t vgm_time;
  byte *pbVar6;
  byte *pbVar7;
  
  pbVar6 = this->pos;
  pbVar4 = this->data_end;
  if ((pbVar4 <= pbVar6) &&
     ((this->super_Classic_Emu).super_Music_Emu.emu_track_ended_ = true, pbVar4 < pbVar6)) {
    (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.warning_ = "Stream lacked end event";
  }
  vgm_time = this->vgm_time;
  this_00 = &this->ym2612;
  do {
    if ((end_time <= vgm_time) || (pbVar4 <= pbVar6)) {
      this->pos = pbVar6;
      this->vgm_time = vgm_time - end_time;
      return end_time * this->blip_time_factor >> 0xc;
    }
    pbVar7 = pbVar6 + 1;
    bVar1 = *pbVar6;
    command = (uint)bVar1;
    uVar2 = bVar1 - 0x4f;
    if (0x18 < uVar2) {
      if (command != 0xe0) goto switchD_0061d843_caseD_54;
      this->pcm_pos =
           this->pcm_data +
           (ulong)pbVar6[1] + (ulong)pbVar6[2] * 0x100 + (ulong)pbVar6[3] * 0x10000 +
           (ulong)pbVar6[4] * 0x1000000;
      pbVar7 = pbVar6 + 5;
      goto LAB_0061dadf;
    }
    __n = (long)&switchD_0061d843::switchdataD_006cb664 +
          (long)(int)(&switchD_0061d843::switchdataD_006cb664)[uVar2];
    lVar5 = (long)vgm_time;
    switch((uint)bVar1) {
    case 0x4f:
      Sms_Apu::write_ggstereo(&this->psg,this->blip_time_factor * vgm_time >> 0xc,(uint)pbVar6[1]);
      goto LAB_0061da17;
    case 0x50:
      Sms_Apu::write_data(&this->psg,this->blip_time_factor * vgm_time >> 0xc,(uint)pbVar6[1]);
LAB_0061da17:
      pbVar7 = pbVar6 + 2;
      break;
    case 0x51:
      iVar3 = Ym_Emu<Ym2413_Emu>::run_until
                        (&this->ym2413,
                         (int)((ulong)(this->fm_time_factor * lVar5 + this->fm_time_offset) >> 0xc))
      ;
      if (iVar3 != 0) {
        Ym2413_Emu::write(&(this->ym2413).super_Ym2413_Emu,(uint)pbVar6[1],(void *)(ulong)pbVar6[2],
                          __n);
      }
      pbVar7 = pbVar6 + 3;
      break;
    case 0x52:
      if (*pbVar7 == 0x2a) {
        write_pcm(this,vgm_time,(uint)pbVar6[2]);
      }
      else {
        iVar3 = Ym_Emu<Ym2612_Emu>::run_until
                          (this_00,(int)((ulong)(this->fm_time_factor * lVar5 + this->fm_time_offset
                                                ) >> 0xc));
        if (iVar3 != 0) {
          bVar1 = *pbVar7;
          if (bVar1 == 0x2b) {
            uVar2 = (pbVar6[2] >> 7) - 1;
            this->dac_disabled = uVar2;
            this->dac_amp = this->dac_amp | uVar2;
            bVar1 = pbVar6[1];
          }
          Ym2612_Emu::write0(&this_00->super_Ym2612_Emu,(uint)bVar1,(uint)pbVar6[2]);
        }
      }
      pbVar7 = pbVar6 + 3;
      break;
    case 0x53:
      iVar3 = Ym_Emu<Ym2612_Emu>::run_until
                        (this_00,(int)((ulong)(this->fm_time_factor * lVar5 + this->fm_time_offset)
                                      >> 0xc));
      if (iVar3 != 0) {
        Ym2612_Emu::write1(&this_00->super_Ym2612_Emu,(uint)pbVar6[1],(uint)pbVar6[2]);
      }
      pbVar7 = pbVar6 + 3;
      break;
    default:
switchD_0061d843_caseD_54:
      if ((bVar1 & 0xf0) == 0x50) goto LAB_0061d917;
      if ((command & 0xfffffff0) == 0x70) {
        vgm_time = vgm_time + (command & 0xf) + 1;
      }
      else if ((command & 0xfffffff0) == 0x80) {
        pbVar6 = this->pcm_pos;
        this->pcm_pos = pbVar6 + 1;
        write_pcm(this,vgm_time,(uint)*pbVar6);
        vgm_time = (command & 0xf) + vgm_time;
      }
      else {
        iVar3 = command_len(command);
        pbVar7 = pbVar7 + (long)iVar3 + -1;
        (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.warning_ = "Unknown stream event";
      }
      break;
    case 0x61:
      vgm_time = vgm_time + (uint)*(ushort *)(pbVar6 + 1);
LAB_0061d917:
      pbVar7 = pbVar6 + 3;
      break;
    case 0x62:
      vgm_time = vgm_time + 0x2df;
      break;
    case 99:
      vgm_time = vgm_time + 0x372;
      break;
    case 100:
      pbVar7 = pbVar6 + 2;
      vgm_time = vgm_time + (uint)pbVar6[1];
      break;
    case 0x66:
      pbVar7 = this->loop_begin;
      break;
    case 0x67:
      uVar2 = *(uint *)(pbVar6 + 3);
      if (pbVar6[2] == 0) {
        this->pcm_data = pbVar6 + 7;
      }
      pbVar7 = pbVar6 + 7 + uVar2;
    }
LAB_0061dadf:
    pbVar4 = this->data_end;
    pbVar6 = pbVar7;
  } while( true );
}

Assistant:

blip_time_t Vgm_Emu_Impl::run_commands( vgm_time_t end_time )
{
	vgm_time_t vgm_time = this->vgm_time; 
	byte const* pos = this->pos;
	if ( pos >= data_end )
	{
		set_track_ended();
		if ( pos > data_end )
			set_warning( "Stream lacked end event" );
	}
	
	while ( vgm_time < end_time && pos < data_end )
	{
		// TODO: be sure there are enough bytes left in stream for particular command
		// so we don't read past end
		switch ( *pos++ )
		{
		case cmd_end:
			pos = loop_begin; // if not looped, loop_begin == data_end
			break;
		
		case cmd_delay_735:
			vgm_time += 735;
			break;
		
		case cmd_delay_882:
			vgm_time += 882;
			break;
		
		case cmd_gg_stereo:
			psg.write_ggstereo( to_blip_time( vgm_time ), *pos++ );
			break;
		
		case cmd_psg:
			psg.write_data( to_blip_time( vgm_time ), *pos++ );
			break;
		
		case cmd_delay:
			vgm_time += pos [1] * 0x100L + pos [0];
			pos += 2;
			break;
		
		case cmd_byte_delay:
			vgm_time += *pos++;
			break;
		
		case cmd_ym2413:
			if ( ym2413.run_until( to_fm_time( vgm_time ) ) )
				ym2413.write( pos [0], pos [1] );
			pos += 2;
			break;
		
		case cmd_ym2612_port0:
			if ( pos [0] == ym2612_dac_port )
			{
				write_pcm( vgm_time, pos [1] );
			}
			else if ( ym2612.run_until( to_fm_time( vgm_time ) ) )
			{
				if ( pos [0] == 0x2B )
				{
					dac_disabled = (pos [1] >> 7 & 1) - 1;
					dac_amp |= dac_disabled;
				}
				ym2612.write0( pos [0], pos [1] );
			}
			pos += 2;
			break;
		
		case cmd_ym2612_port1:
			if ( ym2612.run_until( to_fm_time( vgm_time ) ) )
				ym2612.write1( pos [0], pos [1] );
			pos += 2;
			break;
			
		case cmd_data_block: {
			check( *pos == cmd_end );
			int type = pos [1];
			long size = get_le32( pos + 2 );
			pos += 6;
			if ( type == pcm_block_type )
				pcm_data = pos;
			pos += size;
			break;
		}
		
		case cmd_pcm_seek:
			pcm_pos = pcm_data + pos [3] * 0x1000000L + pos [2] * 0x10000L +
					pos [1] * 0x100L + pos [0];
			pos += 4;
			break;
		
		default:
			int cmd = pos [-1];
			switch ( cmd & 0xF0 )
			{
				case cmd_pcm_delay:
					write_pcm( vgm_time, *pcm_pos++ );
					vgm_time += cmd & 0x0F;
					break;
				
				case cmd_short_delay:
					vgm_time += (cmd & 0x0F) + 1;
					break;
				
				case 0x50:
					pos += 2;
					break;
				
				default:
					pos += command_len( cmd ) - 1;
					set_warning( "Unknown stream event" );
			}
		}
	}
	vgm_time -= end_time;
	this->pos = pos;
	this->vgm_time = vgm_time;
	
	return to_blip_time( end_time );
}